

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_StateData.cpp
# Opt level: O2

void __thiscall amrex::StateData::restartDoit(StateData *this,istream *is,string *chkfile)

{
  MultiFab *pMVar1;
  _Alloc_hider _Var2;
  MFInfo *pMVar3;
  iterator iVar4;
  char *faHeader;
  int iVar5;
  FabArray<amrex::FArrayBox> *mf;
  int nsets;
  undefined1 local_ac [4];
  string FullPathName;
  string mf_name;
  string FullHeaderPathName;
  
  std::istream::_M_extract<double>((double *)is);
  std::istream::_M_extract<double>((double *)is);
  std::istream::_M_extract<double>((double *)is);
  std::istream::_M_extract<double>((double *)is);
  std::istream::operator>>((istream *)is,&nsets);
  FullHeaderPathName._M_dataplus._M_p._0_4_ = StateDescriptor::nComp(this->desc);
  local_ac = (undefined1  [4])StateDescriptor::nExtra(this->desc);
  mf_name._M_dataplus._M_p = (pointer)0x1;
  mf_name._M_string_length = 0;
  mf_name.field_2._M_allocated_capacity = 0;
  mf_name.field_2._8_8_ = 0;
  pMVar3 = MFInfo::SetTag((MFInfo *)&mf_name,"StateData");
  pMVar3->arena = this->arena;
  std::
  make_unique<amrex::MultiFab,amrex::BoxArray&,amrex::DistributionMapping&,int,int,amrex::MFInfo&,amrex::FabFactory<amrex::FArrayBox>&>
            ((BoxArray *)&FullPathName,(DistributionMapping *)&this->grids,(int *)&this->dmap,
             (int *)&FullHeaderPathName,(MFInfo *)local_ac,(FabFactory<amrex::FArrayBox> *)pMVar3);
  _Var2 = FullPathName._M_dataplus;
  FullPathName._M_dataplus._M_p = (pointer)0x0;
  pMVar1 = (this->new_data)._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
           super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
  (this->new_data)._M_t.
  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = (MultiFab *)_Var2._M_p;
  if (pMVar1 != (MultiFab *)0x0) {
    (**(code **)(*(long *)&(pMVar1->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8))();
    if (FullPathName._M_dataplus._M_p != (pointer)0x0) {
      (**(code **)(*(long *)FullPathName._M_dataplus._M_p + 8))();
    }
  }
  FullPathName._M_dataplus._M_p = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&mf_name.field_2);
  pMVar1 = (this->old_data)._M_t.
           super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
           super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
           super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
  (this->old_data)._M_t.
  super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
  super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
  super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = (MultiFab *)0x0;
  if (pMVar1 != (MultiFab *)0x0) {
    (**(code **)(*(long *)&(pMVar1->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8))();
  }
  if (nsets == 2) {
    FullHeaderPathName._M_dataplus._M_p._0_4_ = StateDescriptor::nComp(this->desc);
    local_ac = (undefined1  [4])StateDescriptor::nExtra(this->desc);
    mf_name._M_dataplus._M_p = (pointer)0x1;
    mf_name._M_string_length = 0;
    mf_name.field_2._M_allocated_capacity = 0;
    mf_name.field_2._8_8_ = 0;
    pMVar3 = MFInfo::SetTag((MFInfo *)&mf_name,"StateData");
    pMVar3->arena = this->arena;
    std::
    make_unique<amrex::MultiFab,amrex::BoxArray&,amrex::DistributionMapping&,int,int,amrex::MFInfo&,amrex::FabFactory<amrex::FArrayBox>&>
              ((BoxArray *)&FullPathName,(DistributionMapping *)&this->grids,(int *)&this->dmap,
               (int *)&FullHeaderPathName,(MFInfo *)local_ac,(FabFactory<amrex::FArrayBox> *)pMVar3)
    ;
    _Var2 = FullPathName._M_dataplus;
    FullPathName._M_dataplus._M_p = (pointer)0x0;
    pMVar1 = (this->old_data)._M_t.
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
             super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl;
    (this->old_data)._M_t.
    super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
    super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
    super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl = (MultiFab *)_Var2._M_p;
    if (pMVar1 != (MultiFab *)0x0) {
      (**(code **)(*(long *)&(pMVar1->super_FabArray<amrex::FArrayBox>).super_FabArrayBase + 8))();
      if (FullPathName._M_dataplus._M_p != (pointer)0x0) {
        (**(code **)(*(long *)FullPathName._M_dataplus._M_p + 8))();
      }
    }
    FullPathName._M_dataplus._M_p = (pointer)0x0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&mf_name.field_2);
  }
  if (nsets == 0) {
    FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
              (&((this->new_data)._M_t.
                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
                 super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
                 super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
                super_FabArray<amrex::FArrayBox>,0.0);
  }
  mf_name._M_string_length = 0;
  mf_name.field_2._M_allocated_capacity = mf_name.field_2._M_allocated_capacity & 0xffffffffffffff00
  ;
  FullPathName._M_dataplus._M_p = (pointer)&FullPathName.field_2;
  FullPathName._M_string_length = 0;
  FullPathName.field_2._M_local_buf[0] = '\0';
  iVar5 = 1;
  mf_name._M_dataplus._M_p = (pointer)&mf_name.field_2;
  do {
    if (nsets < iVar5) {
      std::__cxx11::string::~string((string *)&FullPathName);
      std::__cxx11::string::~string((string *)&mf_name);
      return;
    }
    if (iVar5 == 2) {
      mf = &((this->old_data)._M_t.
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
             super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
            super_FabArray<amrex::FArrayBox>;
    }
    else if (iVar5 == 1) {
      mf = &((this->new_data)._M_t.
             super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>._M_t.
             super__Tuple_impl<0UL,_amrex::MultiFab_*,_std::default_delete<amrex::MultiFab>_>.
             super__Head_base<0UL,_amrex::MultiFab_*,_false>._M_head_impl)->
            super_FabArray<amrex::FArrayBox>;
    }
    else {
      Abort_host("**** Error in StateData::restart:  invalid nsets.");
      mf = (FabArray<amrex::FArrayBox> *)0x0;
    }
    std::operator>>(is,(string *)&mf_name);
    std::__cxx11::string::_M_assign((string *)&FullPathName);
    if ((chkfile->_M_string_length != 0) &&
       ((chkfile->_M_dataplus)._M_p[chkfile->_M_string_length - 1] != '/')) {
      std::__cxx11::string::push_back((char)&FullPathName);
    }
    std::__cxx11::string::append((string *)&FullPathName);
    std::operator+(&FullHeaderPathName,&FullPathName,"_H");
    if (faHeaderMap_abi_cxx11_ ==
        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>_>_>
         *)0x0) {
LAB_0057a5a4:
      faHeader = (char *)0x0;
    }
    else {
      iVar4 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_amrex::Vector<char,_std::allocator<char>_>_>_>_>
              ::find(faHeaderMap_abi_cxx11_,&FullHeaderPathName);
      if ((_Rb_tree_header *)iVar4._M_node ==
          &(faHeaderMap_abi_cxx11_->_M_impl).super__Rb_tree_header) goto LAB_0057a5a4;
      faHeader = *(char **)(iVar4._M_node + 2);
    }
    VisMF::Read(mf,&FullPathName,faHeader,0,0);
    std::__cxx11::string::~string((string *)&FullHeaderPathName);
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

void
StateData::restartDoit (std::istream& is, const std::string& chkfile)
{
    BL_PROFILE("StateData::restartDoit()");

    is >> old_time.start;
    is >> old_time.stop;
    is >> new_time.start;
    is >> new_time.stop;

    int nsets;
    is >> nsets;

    new_data = std::make_unique<MultiFab>(grids,dmap,desc->nComp(),desc->nExtra(),
                                          MFInfo().SetTag("StateData").SetArena(arena),
                                          *m_factory);
    old_data.reset();
    if (nsets == 2) {
        old_data = std::make_unique<MultiFab>(grids,dmap,desc->nComp(),desc->nExtra(),
                                              MFInfo().SetTag("StateData").SetArena(arena),
                                              *m_factory);
    }
    //
    // If no data is written then we just allocate the MF instead of reading it in.
    // This assumes that the application will do something with it.
    // We set it to zero in case a compiler complains about uninitialized data.
    //
    if (nsets == 0) {
       new_data->setVal(0.0_rt);
    }

    std::string mf_name;
    std::string FullPathName;

    for(int ns(1); ns <= nsets; ++ns) {
        MultiFab *whichMF = nullptr;
        if(ns == 1) {
            whichMF = new_data.get();
        } else if(ns == 2) {
            whichMF = old_data.get();
        } else {
            amrex::Abort("**** Error in StateData::restart:  invalid nsets.");
        }

        is >> mf_name;
        //
        // Note that mf_name is relative to the Header file.
        // We need to prepend the name of the chkfile directory.
        //
        FullPathName = chkfile;
        if ( ! chkfile.empty() && chkfile[chkfile.length()-1] != '/') {
            FullPathName += '/';
        }
        FullPathName += mf_name;

        // ---- check for preread header
        std::string FullHeaderPathName(FullPathName + "_H");
        const char *faHeader = 0;
        if(faHeaderMap != 0) {
            std::map<std::string, Vector<char> >::iterator fahmIter;
            fahmIter = faHeaderMap->find(FullHeaderPathName);
            if(fahmIter != faHeaderMap->end()) {
                faHeader = fahmIter->second.dataPtr();
            }
        }

        VisMF::Read(*whichMF, FullPathName, faHeader);
    }
}